

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

char * getstr(identval *v,int type)

{
  int type_local;
  identval *v_local;
  
  switch(type) {
  case 1:
    v_local = (identval *)intstr((v->field_0).i);
    break;
  case 2:
    v_local = (identval *)floatstr((v->field_0).f);
    break;
  case 3:
  case 6:
    v_local = (identval *)(v->field_0).id;
    break;
  default:
    v_local = (identval *)0x1ae8c3;
  }
  return (char *)v_local;
}

Assistant:

static inline const char *getstr(const identval &v, int type) 
{
    switch(type)
    {
        case VAL_STR: case VAL_MACRO: return v.s;
        case VAL_INT: return intstr(v.i);
        case VAL_FLOAT: return floatstr(v.f);
        default: return "";
    }
}